

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_avx2::c_imm_v128_shr_n_s8<5>(simd_test_avx2 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  c_v128 cVar6;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[0];
  auVar2 = vpsrlw_avx(auVar2,5);
  auVar4[8] = 7;
  auVar4._0_8_ = 0x707070707070707;
  auVar4[9] = 7;
  auVar4[10] = 7;
  auVar4[0xb] = 7;
  auVar4[0xc] = 7;
  auVar4[0xd] = 7;
  auVar4[0xe] = 7;
  auVar4[0xf] = 7;
  auVar5[8] = 4;
  auVar5._0_8_ = 0x404040404040404;
  auVar5[9] = 4;
  auVar5[10] = 4;
  auVar5[0xb] = 4;
  auVar5[0xc] = 4;
  auVar5[0xd] = 4;
  auVar5[0xe] = 4;
  auVar5[0xf] = 4;
  auVar2 = vpand_avx(auVar2,auVar4);
  auVar1 = vpsubb_avx(auVar2 ^ auVar5,auVar5);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this;
  auVar2 = vpsrlw_avx(auVar3,5);
  auVar2 = vpand_avx(auVar2,auVar4);
  auVar2 = vpsubb_avx(auVar2 ^ auVar5,auVar5);
  cVar6.u64[1] = auVar1._0_8_;
  cVar6.u64[0] = auVar2._0_8_;
  return cVar6;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}